

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependencyKeyIDs.h
# Opt level: O0

void __thiscall
llbuild::core::DependencyKeyIDs::push_back
          (DependencyKeyIDs *this,KeyID id,bool orderOnlyFlag,bool singleUseFlag)

{
  byte local_1b;
  byte local_1a;
  byte local_19;
  bool singleUseFlag_local;
  DependencyKeyIDs *pDStack_18;
  bool orderOnlyFlag_local;
  DependencyKeyIDs *this_local;
  KeyID id_local;
  
  local_1a = singleUseFlag;
  local_19 = orderOnlyFlag;
  pDStack_18 = this;
  this_local = (DependencyKeyIDs *)id._value;
  std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>::push_back
            (&this->keys,(value_type *)&this_local);
  local_1b = (local_1a & 1) << 1 | local_19 & 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->flags,&local_1b);
  return;
}

Assistant:

void push_back(KeyID id, bool orderOnlyFlag, bool singleUseFlag) {
    keys.push_back(id);
    flags.push_back((singleUseFlag << 1) | orderOnlyFlag);
  }